

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall
CLI::OptionNotFound::OptionNotFound(OptionNotFound *this,string *msg,ExitCodes exit_code)

{
  string *in_RSI;
  undefined8 *in_RDI;
  string local_70 [55];
  allocator local_39;
  string local_38 [4];
  ExitCodes in_stack_ffffffffffffffcc;
  string *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  Error *in_stack_ffffffffffffffe0;
  
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_38,"OptionNotFound",&local_39);
  ::std::__cxx11::string::string(local_70,in_RSI);
  Error::Error(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffcc);
  ::std::__cxx11::string::~string(local_70);
  ::std::__cxx11::string::~string(local_38);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  *in_RDI = &PTR__OptionNotFound_001b6350;
  return;
}

Assistant:

explicit OptionNotFound(std::string name) : OptionNotFound(name + " not found", ExitCodes::OptionNotFound) {}